

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.hpp
# Opt level: O0

enable_if_t<std::is_base_of_v<Serializable,_Bar>,_void> __thiscall
miyuki::serialize::InputArchive::_load<Bar>(InputArchive *this,shared_ptr<Bar> *ptr)

{
  bool bVar1;
  int iVar2;
  json *pjVar3;
  const_reference pvVar4;
  undefined4 extraout_var;
  mapped_type *this_00;
  long lVar5;
  element_type *peVar6;
  key_type kVar7;
  Bar *local_248;
  Bar *local_220;
  key_type local_1b8;
  shared_ptr<Bar> local_1b0;
  allocator<char> local_199;
  key_type local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  key_type local_158;
  long addr_1;
  key_type local_148;
  shared_ptr<Bar> local_128;
  shared_ptr<Bar> local_118;
  key_type local_108;
  shared_ptr<Bar> local_100;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>,_false>
  local_f0;
  key_type local_e8;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>,_false>
  local_e0;
  iterator it;
  key_type local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  key_type local_90;
  long addr;
  Type *type;
  allocator<char> local_69;
  key_type local_68;
  undefined1 local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> type_s;
  shared_ptr<Bar> *ptr_local;
  InputArchive *this_local;
  
  pjVar3 = _top_abi_cxx11_(this);
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::is_null(pjVar3);
  if (bVar1) {
    std::shared_ptr<Bar>::shared_ptr((shared_ptr<Bar> *)((long)&type_s.field_2 + 8),(nullptr_t)0x0);
    std::shared_ptr<Bar>::operator=(ptr,(shared_ptr<Bar> *)((long)&type_s.field_2 + 8));
    std::shared_ptr<Bar>::~shared_ptr((shared_ptr<Bar> *)((long)&type_s.field_2 + 8));
  }
  else {
    pjVar3 = _top_abi_cxx11_(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"type",&local_69);
    pvVar4 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(pjVar3,&local_68);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,pvVar4)
    ;
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    iVar2 = (**this->context->_vptr_Context)(this->context,local_48);
    addr = CONCAT44(extraout_var,iVar2);
    pjVar3 = _top_abi_cxx11_(this);
    bVar1 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::contains<const_char_(&)[6],_0>(pjVar3,(char (*) [6])"props");
    if (bVar1) {
      pjVar3 = _top_abi_cxx11_(this);
      bVar1 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::contains<const_char_(&)[5],_0>(pjVar3,(char (*) [5])"addr");
      if (bVar1) {
        pjVar3 = _top_abi_cxx11_(this);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,"addr",
                   (allocator<char> *)
                   ((long)&it.
                           super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>,_false>
                           ._M_cur + 7));
        pvVar4 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 ::at(pjVar3,&local_d0);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_b0,pvVar4);
        kVar7 = std::__cxx11::stol(&local_b0,(size_t *)0x0,10);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&it.
                           super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>,_false>
                           ._M_cur + 7));
        local_e8 = kVar7;
        local_90 = kVar7;
        local_e0._M_cur =
             (__node_type *)
             std::
             unordered_map<unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>_>_>
             ::find(&this->ptrs,&local_e8);
        local_f0._M_cur =
             (__node_type *)
             std::
             unordered_map<unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>_>_>
             ::end(&this->ptrs);
        bVar1 = std::__detail::operator==(&local_e0,&local_f0);
        if (bVar1) {
          lVar5 = (**(code **)(*(long *)addr + 8))();
          if (lVar5 == 0) {
            local_220 = (Bar *)0x0;
          }
          else {
            local_220 = (Bar *)__dynamic_cast(lVar5,&Serializable::typeinfo,&Bar::typeinfo,0);
          }
          std::shared_ptr<Bar>::shared_ptr<Bar,void>(&local_100,local_220);
          std::shared_ptr<Bar>::operator=(ptr,&local_100);
          std::shared_ptr<Bar>::~shared_ptr(&local_100);
          local_108 = local_90;
          this_00 = std::
                    unordered_map<unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>_>_>
                    ::operator[](&this->ptrs,&local_108);
          std::shared_ptr<miyuki::serialize::Serializable>::operator=(this_00,ptr);
        }
        else {
          std::__detail::
          _Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>,_false,_false>
          ::operator->((_Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>,_false,_false>
                        *)&local_e0);
          std::dynamic_pointer_cast<Bar,miyuki::serialize::Serializable>
                    ((shared_ptr<miyuki::serialize::Serializable> *)&local_118);
          std::shared_ptr<Bar>::operator=(ptr,&local_118);
          std::shared_ptr<Bar>::~shared_ptr(&local_118);
        }
      }
      else {
        lVar5 = (**(code **)(*(long *)addr + 8))();
        if (lVar5 == 0) {
          local_248 = (Bar *)0x0;
        }
        else {
          local_248 = (Bar *)__dynamic_cast(lVar5,&Serializable::typeinfo,&Bar::typeinfo,0);
        }
        std::shared_ptr<Bar>::shared_ptr<Bar,void>(&local_128,local_248);
        std::shared_ptr<Bar>::operator=(ptr,&local_128);
        std::shared_ptr<Bar>::~shared_ptr(&local_128);
      }
      pjVar3 = _top_abi_cxx11_(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_148,"props",(allocator<char> *)((long)&addr_1 + 7));
      pvVar4 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::at(pjVar3,&local_148);
      _makeNode(this,pvVar4);
      std::__cxx11::string::~string((string *)&local_148);
      std::allocator<char>::~allocator((allocator<char> *)((long)&addr_1 + 7));
      lVar5 = addr;
      peVar6 = std::__shared_ptr_access<Bar,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                         ((__shared_ptr_access<Bar,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)ptr)
      ;
      (**(code **)(*(long *)lVar5 + 0x18))(lVar5,peVar6,this);
      _popNode(this);
    }
    else {
      pjVar3 = _top_abi_cxx11_(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"addr",&local_199);
      pvVar4 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::at(pjVar3,&local_198);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_178,pvVar4);
      kVar7 = std::__cxx11::stol(&local_178,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_198);
      std::allocator<char>::~allocator(&local_199);
      local_1b8 = kVar7;
      local_158 = kVar7;
      std::
      unordered_map<unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>_>_>
      ::at(&this->ptrs,&local_1b8);
      std::dynamic_pointer_cast<Bar,miyuki::serialize::Serializable>
                ((shared_ptr<miyuki::serialize::Serializable> *)&local_1b0);
      std::shared_ptr<Bar>::operator=(ptr,&local_1b0);
      std::shared_ptr<Bar>::~shared_ptr(&local_1b0);
    }
    std::__cxx11::string::~string((string *)local_48);
  }
  return;
}

Assistant:

std::enable_if_t<std::is_base_of_v<Serializable, T>, void>
        _load(std::shared_ptr<T> &ptr) {
            if (_top().is_null()) {
                ptr = nullptr;
                return;
            }
            auto type_s = _top().at("type").get<std::string>();
            auto type = context.getType(type_s);
            if (_top().contains("props")) {
                if (_top().contains("addr")) {
                    auto addr = std::stol(_top().at("addr").get<std::string>());
                    auto it = ptrs.find(addr);
                    if (it == ptrs.end()) {
                        ptr = std::shared_ptr<T>(dynamic_cast<T *>(type->_create()));
                        ptrs[addr] = ptr;
                    } else {
                        ptr = std::dynamic_pointer_cast<T>(it->second);
                    }
                } else {
                    ptr = std::shared_ptr<T>(dynamic_cast<T *>(type->_create()));
                }
                _makeNode(_top().at("props"));
                type->load(*ptr, *this);
                _popNode();
            } else {
                auto addr = std::stol(_top().at("addr").get<std::string>());
                ptr = std::dynamic_pointer_cast<T>(ptrs.at(addr));
            }
        }